

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.c
# Opt level: O0

void CopyStats(SymbolStats *source,SymbolStats *dest)

{
  void *in_RSI;
  void *in_RDI;
  
  memcpy(in_RSI,in_RDI,0x900);
  memcpy((void *)((long)in_RSI + 0x900),(void *)((long)in_RDI + 0x900),0x100);
  memcpy((void *)((long)in_RSI + 0xa00),(void *)((long)in_RDI + 0xa00),0x900);
  memcpy((void *)((long)in_RSI + 0x1300),(void *)((long)in_RDI + 0x1300),0x100);
  return;
}

Assistant:

static void CopyStats(SymbolStats* source, SymbolStats* dest) {
  memcpy(dest->litlens, source->litlens,
         ZOPFLI_NUM_LL * sizeof(dest->litlens[0]));
  memcpy(dest->dists, source->dists, ZOPFLI_NUM_D * sizeof(dest->dists[0]));

  memcpy(dest->ll_symbols, source->ll_symbols,
         ZOPFLI_NUM_LL * sizeof(dest->ll_symbols[0]));
  memcpy(dest->d_symbols, source->d_symbols,
         ZOPFLI_NUM_D * sizeof(dest->d_symbols[0]));
}